

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder_helpers.hpp
# Opt level: O3

disp_binding_activator_t * __thiscall
so_5::disp::reuse::
binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_one_thread::strictly_ordered::private_dispatcher_t>,_so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
::bind_agent(disp_binding_activator_t *__return_storage_ptr__,
            binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::prio_one_thread::strictly_ordered::private_dispatcher_t>,_so_5::disp::prio_one_thread::strictly_ordered::impl::proxy_dispatcher_t,_so_5::disp::prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t>
            *this,environment_t *param_1,agent_ref_t *agent)

{
  atomic_refcounted_t *paVar1;
  proxy_dispatcher_t *disp;
  agent_ref_t local_10;
  
  disp = this->m_instance;
  local_10 = (agent_ref_t)agent->m_obj;
  agent->m_obj = (agent_t *)0x0;
  prio_one_thread::strictly_ordered::impl::binding_actions_mixin_t::do_bind
            (__return_storage_ptr__,(binding_actions_mixin_t *)this,(actual_disp_iface_t *)disp,
             &local_10);
  if (local_10.m_obj != (agent_t *)0x0) {
    LOCK();
    paVar1 = &(local_10.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_10.m_obj != (agent_t *)0x0)) {
      (*(local_10.m_obj)->_vptr_agent_t[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual disp_binding_activator_t
		bind_agent(
			environment_t & /* env */,
			agent_ref_t agent ) override
			{
				return this->do_bind( m_instance, std::move( agent ) );
			}